

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-write.c
# Opt level: O1

int mp3_fill_hdr(mp3_frame_t *frame)

{
  bv_t bv;
  bv_t local_20;
  
  if (frame != (mp3_frame_t *)0x0) {
    bv_init(&local_20,frame->raw,0x20);
    bv_put_bits(&local_20,0xfff,0xc);
    bv_put_bits(&local_20,(ulong)frame->id,1);
    bv_put_bits(&local_20,(ulong)frame->layer,2);
    bv_put_bits(&local_20,(ulong)frame->protected,1);
    bv_put_bits(&local_20,(ulong)frame->bitrate_index,4);
    bv_put_bits(&local_20,(ulong)frame->samplerfindex,2);
    bv_put_bits(&local_20,(ulong)frame->padding_bit,1);
    bv_put_bits(&local_20,(ulong)frame->private_bit,1);
    bv_put_bits(&local_20,(ulong)frame->mode,2);
    bv_put_bits(&local_20,(ulong)frame->mode_ext,2);
    bv_put_bits(&local_20,(ulong)frame->copyright,1);
    bv_put_bits(&local_20,(ulong)frame->original,1);
    bv_put_bits(&local_20,(ulong)frame->emphasis,2);
    if (frame->protected == '\0') {
      *(undefined2 *)(frame->raw + 4) = *(undefined2 *)frame->crc;
    }
    mp3_calc_hdr(frame);
    return 1;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-write.c",0x68,
                "int mp3_fill_hdr(mp3_frame_t *)");
}

Assistant:

int mp3_fill_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);
  
  bv_t bv;
  bv_init(&bv, frame->raw, 4 * 8);

  bv_put_bits(&bv, 0xFFF, 12);
  bv_put_bits(&bv, frame->id, 1);
  bv_put_bits(&bv, frame->layer, 2);
  bv_put_bits(&bv, frame->protected, 1);
  bv_put_bits(&bv, frame->bitrate_index, 4);
  bv_put_bits(&bv, frame->samplerfindex, 2);
  bv_put_bits(&bv, frame->padding_bit, 1);
  bv_put_bits(&bv, frame->private_bit, 1);
  bv_put_bits(&bv, frame->mode, 2);
  bv_put_bits(&bv, frame->mode_ext, 2);
  bv_put_bits(&bv, frame->copyright, 1);
  bv_put_bits(&bv, frame->original, 1);
  bv_put_bits(&bv, frame->emphasis, 2);
  if (frame->protected == 0) {
    frame->raw[4] = frame->crc[0];
    frame->raw[5] = frame->crc[1];
  }

  assert((bv.idx == bv.len) || "Bitvector is not filled completely");
  
  mp3_calc_hdr(frame);

  return 1;
}